

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O1

ShaderCodeBufferDesc * __thiscall
Diligent::ShaderVkImpl::GetConstantBufferDesc(ShaderVkImpl *this,Uint32 Index)

{
  Uint32 UVar1;
  ShaderCodeBufferDesc *pSVar2;
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  local_34 = Index;
  if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i < SHADER_STATUS_READY) {
    FormatString<char[109]>
              (&local_30,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0x151);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  UVar1 = GetResourceCount(this);
  if (local_34 < UVar1) {
    pSVar2 = SPIRVShaderResources::GetUniformBufferDesc
                       ((this->m_pShaderResources).
                        super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_34);
  }
  else {
    FormatString<char[17],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Resource index (",(char (*) [17])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0x156);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pSVar2 = (ShaderCodeBufferDesc *)0x0;
  }
  return pSVar2;
}

Assistant:

const ShaderCodeBufferDesc* ShaderVkImpl::GetConstantBufferDesc(Uint32 Index) const
{
    DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    const Uint32 ResCount = GetResourceCount();
    if (Index >= ResCount)
    {
        UNEXPECTED("Resource index (", Index, ") is out of range");
        return nullptr;
    }

    // Uniform buffers always go first in the list of resources
    return m_pShaderResources->GetUniformBufferDesc(Index);
}